

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeTemperamentBad
          (MidiMessage *this,double maxDeviationCents,int referencePitchClass,int channelMask)

{
  bool bVar1;
  int iVar2;
  reference pdVar3;
  double *item;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  allocator<double> local_39;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> temperament;
  int channelMask_local;
  int referencePitchClass_local;
  double maxDeviationCents_local;
  MidiMessage *this_local;
  
  _channelMask_local = maxDeviationCents;
  if (maxDeviationCents < 0.0) {
    _channelMask_local = -maxDeviationCents;
  }
  if (100.0 < _channelMask_local) {
    _channelMask_local = 100.0;
  }
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = channelMask;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = referencePitchClass;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,0xc,&local_39);
  std::allocator<double>::~allocator(&local_39);
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_38);
  item = (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&item);
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    iVar2 = rand();
    *pdVar3 = ((double)iVar2 / 2147483647.0 + (double)iVar2 / 2147483647.0 + -1.0) *
              _channelMask_local;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  makeMts9_TemperamentByCentsDeviationFromET
            (this,(vector<double,_std::allocator<double>_> *)local_38,
             temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return;
}

Assistant:

void MidiMessage::makeTemperamentBad(double maxDeviationCents, int referencePitchClass, int channelMask) {
	if (maxDeviationCents < 0.0) {
		maxDeviationCents = -maxDeviationCents;
	}
	if (maxDeviationCents > 100.0) {
		maxDeviationCents = 100.0;
	}
	std::vector<double> temperament(12);
	for (double &item : temperament) {
		item = ((rand() / (double)RAND_MAX) * 2.0 - 1.0) * maxDeviationCents;
	}
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}